

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

int __thiscall
EventDispatcherHelper::addEventListener
          (EventDispatcherHelper *this,IEventListener *listener,int event_id)

{
  EventListenerNode *local_40;
  EventListenerNode *node;
  AutoLock _auto_lock_;
  int event_id_local;
  IEventListener *listener_local;
  EventDispatcherHelper *this_local;
  
  _auto_lock_._20_4_ = event_id;
  AutoLock::AutoLock((AutoLock *)&node,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                     ,0x66);
  local_40 = (EventListenerNode *)
             operator_new(0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                          ,0x68);
  local_40->mListener = listener;
  local_40->mEventId = _auto_lock_._20_4_;
  JetHead::list<EventDispatcherHelper::EventListenerNode_*>::push_back(&this->mEventList,&local_40);
  AutoLock::~AutoLock((AutoLock *)&node);
  return 0;
}

Assistant:

int EventDispatcherHelper::addEventListener( IEventListener *listener, int event_id )
{
	DebugAutoLock( mLock );
	
	EventListenerNode *node = jh_new EventListenerNode;
	
	node->mListener = listener;
	node->mEventId = event_id;
	
	mEventList.push_back( node );

	return 0;
}